

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

Value * duckdb::NumericValueUnionToValueInternal(LogicalType *type,NumericValueUnion *val)

{
  PhysicalType PVar1;
  string *msg;
  LogicalType *in_RSI;
  Value *in_RDI;
  allocator *this;
  allocator local_59;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  uhugeint_t in_stack_ffffffffffffffb0;
  
  PVar1 = LogicalType::InternalType(in_RSI);
  switch(PVar1) {
  case BOOL:
    Value::BOOLEAN((bool)in_stack_ffffffffffffffaf);
    break;
  case UINT8:
    Value::UTINYINT(in_stack_ffffffffffffffaf);
    break;
  case INT8:
    Value::TINYINT(in_stack_ffffffffffffffaf);
    break;
  case UINT16:
    Value::USMALLINT(CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
    break;
  case INT16:
    Value::SMALLINT(CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
    break;
  case UINT32:
    Value::UINTEGER(CONCAT13(in_stack_ffffffffffffffaf,
                             CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)));
    break;
  case INT32:
    Value::INTEGER(CONCAT13(in_stack_ffffffffffffffaf,
                            CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)));
    break;
  case UINT64:
    Value::UBIGINT(CONCAT17(in_stack_ffffffffffffffaf,
                            CONCAT16(in_stack_ffffffffffffffae,
                                     CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)))
                  );
    break;
  case INT64:
    Value::BIGINT(CONCAT17(in_stack_ffffffffffffffaf,
                           CONCAT16(in_stack_ffffffffffffffae,
                                    CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))))
    ;
    break;
  case FLOAT:
    Value::FLOAT((float)CONCAT13(in_stack_ffffffffffffffaf,
                                 CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)));
    break;
  case DOUBLE:
    Value::DOUBLE((double)CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT24(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8))));
    break;
  case UINT128:
    Value::UHUGEINT(in_stack_ffffffffffffffb0);
    break;
  case INT128:
    Value::HUGEINT((hugeint_t)in_stack_ffffffffffffffb0);
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this = &local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffa8,"Unsupported type for NumericValueUnionToValue",
               this);
    InternalException::InternalException((InternalException *)this,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

Value NumericValueUnionToValueInternal(const LogicalType &type, const NumericValueUnion &val) {
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		return Value::BOOLEAN(val.value_.boolean);
	case PhysicalType::INT8:
		return Value::TINYINT(val.value_.tinyint);
	case PhysicalType::INT16:
		return Value::SMALLINT(val.value_.smallint);
	case PhysicalType::INT32:
		return Value::INTEGER(val.value_.integer);
	case PhysicalType::INT64:
		return Value::BIGINT(val.value_.bigint);
	case PhysicalType::UINT8:
		return Value::UTINYINT(val.value_.utinyint);
	case PhysicalType::UINT16:
		return Value::USMALLINT(val.value_.usmallint);
	case PhysicalType::UINT32:
		return Value::UINTEGER(val.value_.uinteger);
	case PhysicalType::UINT64:
		return Value::UBIGINT(val.value_.ubigint);
	case PhysicalType::INT128:
		return Value::HUGEINT(val.value_.hugeint);
	case PhysicalType::UINT128:
		return Value::UHUGEINT(val.value_.uhugeint);
	case PhysicalType::FLOAT:
		return Value::FLOAT(val.value_.float_);
	case PhysicalType::DOUBLE:
		return Value::DOUBLE(val.value_.double_);
	default:
		throw InternalException("Unsupported type for NumericValueUnionToValue");
	}
}